

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_codim_mesh_data_set.h
# Opt level: O3

void __thiscall
lf::mesh::utils::
AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
::AllCodimMeshDataSet
          (AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
           *this,shared_ptr<const_lf::mesh::Mesh> *mesh)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  pointer pvVar3;
  dim_t dVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  (this->
  super_MeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
  )._vptr_MeshDataSet = (_func_int **)&PTR_operator___00516718;
  dVar4 = (**((mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_Mesh)();
  this->dim_mesh_ = dVar4;
  (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar7 = (ulong)(this->dim_mesh_ + 1);
  (this->data_).m_holder.m_start = (pointer)0x0;
  (this->data_).m_holder.m_size = uVar7;
  (this->data_).m_holder.m_capacity = 0;
  boost::container::
  vector_alloc_holder<boost::container::new_allocator<boost::container::vector<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>,_void,_void>_>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  ::do_initial_capacity<unsigned_long>(&(this->data_).m_holder,uVar7);
  if (uVar7 != 0) {
    memset((this->data_).m_holder.m_start,0,uVar7 * 0x18);
  }
  uVar6 = 0;
  do {
    uVar7 = (ulong)uVar6;
    if ((this->data_).m_holder.m_size <= uVar7) {
      boost::assertion_failed
                ("this->m_holder.m_size > n",
                 "reference boost::container::vector<boost::container::vector<std::variant<std::monostate, lf::fe::FePoint<double>, lf::fe::FeHierarchicSegment<double>, lf::fe::FeHierarchicTria<double>, lf::fe::FeHierarchicQuad<double>>>>::operator[](size_type) [T = boost::container::vector<std::variant<std::monostate, lf::fe::FePoint<double>, lf::fe::FeHierarchicSegment<double>, lf::fe::FeHierarchicTria<double>, lf::fe::FeHierarchicQuad<double>>>, A = void, Options = void]"
                 ,
                 "/root/.hunter/_Base/7456937/c3d17be/2b93a9d/Install/include/boost/container/vector.hpp"
                 ,0x6cb);
    }
    peVar2 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pvVar3 = (this->data_).m_holder.m_start;
    iVar5 = (*peVar2->_vptr_Mesh[3])(peVar2,uVar7);
    boost::container::
    vector<std::variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>,void,void>
    ::
    priv_resize<boost::container::value_init_t,boost::move_detail::integral_constant<unsigned_int,1u>>
              ((vector<std::variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>,void,void>
                *)(pvVar3 + uVar7),iVar5,&boost::container::value_init);
    uVar6 = uVar6 + 1;
  } while (uVar6 <= this->dim_mesh_);
  return;
}

Assistant:

explicit AllCodimMeshDataSet(
      const std::shared_ptr<const lf::mesh::Mesh>& mesh)
      : MeshDataSet<T>(),
        dim_mesh_(mesh->DimMesh()),
        mesh_(mesh),
        data_(dim_mesh_ + 1) {
    for (dim_t codim = 0; codim <= dim_mesh_; ++codim) {
      data_[codim].resize(mesh_->NumEntities(codim));
    }
  }